

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall FBehavior::GetArrayVal(FBehavior *this,int arraynum,int index)

{
  ArrayInfo *array;
  int index_local;
  int arraynum_local;
  FBehavior *this_local;
  
  if ((uint)arraynum < (uint)this->NumTotalArrays) {
    if ((uint)index < this->Arrays[arraynum]->ArraySize) {
      this_local._4_4_ = this->Arrays[arraynum]->Elements[index];
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int FBehavior::GetArrayVal (int arraynum, int index) const
{
	if ((unsigned)arraynum >= (unsigned)NumTotalArrays)
		return 0;
	const ArrayInfo *array = Arrays[arraynum];
	if ((unsigned)index >= (unsigned)array->ArraySize)
		return 0;
	return array->Elements[index];
}